

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

StructType * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::StructType,LLVMBC::LLVMContext&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
          (LLVMContext *this,LLVMContext *u,
          vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *u_1)

{
  vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *context;
  vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> local_48;
  StructType *local_30;
  StructType *t;
  StructType *mem;
  vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *u_local_1;
  LLVMContext *u_local;
  LLVMContext *this_local;
  
  mem = (StructType *)u_1;
  u_local_1 = (vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)u;
  u_local = this;
  local_30 = (StructType *)allocate(this,0x28,8);
  context = u_local_1;
  t = local_30;
  if (local_30 == (StructType *)0x0) {
    std::terminate();
  }
  std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::vector
            (&local_48,
             (vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)mem);
  StructType::StructType(local_30,(LLVMContext *)context,&local_48);
  std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::~vector(&local_48);
  append_typed_destructor<LLVMBC::StructType>(this,local_30);
  return local_30;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}